

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.hpp
# Opt level: O2

notes_iterator __thiscall
OPNMIDIplay::MIDIchannel::find_or_create_activenote(MIDIchannel *this,uint note)

{
  notes_iterator i;
  NoteInfo ni;
  NoteInfo local_98;
  
  i = find_activenote(this,note);
  if (((i.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next ==
      (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
    local_98.note = (uint8_t)note;
    i.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
              pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::insert
                        (&this->activenotes,(iterator)&(this->activenotes).endcell_,&local_98);
  }
  else {
    cleanupNote(this,i);
  }
  return (notes_iterator)i.cell_;
}

Assistant:

notes_iterator find_or_create_activenote(unsigned note)
        {
            notes_iterator it = find_activenote(note);
            if(!it.is_end())
                cleanupNote(it);
            else
            {
                NoteInfo ni;
                ni.note = note;
                it = activenotes.insert(activenotes.end(), ni);
            }
            return it;
        }